

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O1

void __thiscall
r_exec::ConstGuardBuilder::_build
          (ConstGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  ushort uVar1;
  ConstGuardBuilder *pCVar2;
  undefined2 uVar3;
  uint16_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uint16_t uVar7;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  TimingGuardBuilder *pTVar8;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  undefined1 local_64 [6];
  uint16_t extent_index;
  uint local_5c;
  uint local_58;
  uint16_t local_54;
  uint16_t local_52;
  undefined4 local_50;
  undefined4 local_4c;
  ConstGuardBuilder *local_48;
  uint local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_48 = (ConstGuardBuilder *)CONCAT44(local_48._4_4_,(int)CONCAT62(in_register_0000008a,t0));
  local_50 = (undefined4)CONCAT62(in_register_00000082,q0);
  local_34 = (undefined4)CONCAT62(in_register_00000012,fwd_opcode);
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  uVar3 = r_code::Atom::asIndex();
  local_5c = CONCAT22(local_5c._2_2_,uVar3);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar3 = r_code::Atom::asIndex();
  local_58 = CONCAT22(local_58._2_2_,uVar3);
  plVar6 = (long *)(**(code **)(*plVar6 + 0x48))(plVar6,0);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  local_4c = r_code::Atom::asIndex();
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  local_52 = r_code::Atom::asIndex();
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar4 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar5),(Atom *)local_64);
  local_38 = (undefined4)CONCAT62(in_register_0000000a,bwd_opcode);
  local_54 = uVar4;
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Set((uchar)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),(Atom *)local_64);
  pTVar8 = (TimingGuardBuilder *)local_64;
  r_code::Atom::~Atom((Atom *)pTVar8);
  extent_index = *write_index + 3;
  uVar4 = (uint16_t)local_5c;
  local_5c = local_5c & 0xffff;
  local_3c = (uint)(ushort)local_48;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,uVar4,(ushort)local_48,Opcodes::Add,(this->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  uVar4 = (uint16_t)local_58;
  local_58 = local_58 & 0xffff;
  local_48 = this;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,uVar4,t1,Opcodes::Add,(this->super_TimingGuardBuilder).period,write_index,
             &extent_index);
  uVar7 = extent_index;
  uVar1 = extent_index + 1;
  extent_index = uVar1;
  r_code::Atom::AssignmentPointer((uchar)local_64,(ushort)(byte)local_4c);
  uVar4 = *write_index;
  *write_index = uVar4 + 1;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar4 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)local_34);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::VLPointer((ushort)local_64,(ushort)local_50);
  extent_index = uVar7 + 2;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  pCVar2 = local_48;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Float((float)pCVar2->constant);
  extent_index = uVar7 + 3;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 4;
  *write_index = extent_index;
  *write_index = uVar7 + 5;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Set((uchar)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar5),(Atom *)local_64);
  pTVar8 = (TimingGuardBuilder *)local_64;
  r_code::Atom::~Atom((Atom *)pTVar8);
  extent_index = *write_index + 5;
  uVar4 = (uint16_t)local_5c;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,(uint16_t)local_3c,uVar4,Opcodes::Sub,
             (pCVar2->super_TimingGuardBuilder).period,write_index,&extent_index);
  uVar7 = (uint16_t)local_58;
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,t1,uVar7,Opcodes::Sub,(pCVar2->super_TimingGuardBuilder).period,write_index,
             &extent_index);
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,local_52,uVar4,Opcodes::Sub,pCVar2->offset,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar8,mdl,local_54,uVar7,Opcodes::Sub,pCVar2->offset,write_index,&extent_index);
  uVar7 = extent_index;
  uVar1 = extent_index + 1;
  extent_index = uVar1;
  r_code::Atom::AssignmentPointer((uchar)local_64,(ushort)(byte)local_50);
  uVar4 = *write_index;
  *write_index = uVar4 + 1;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar4 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)local_38);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::VLPointer((ushort)local_64,(ushort)local_4c);
  extent_index = uVar7 + 2;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  pCVar2 = local_48;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Float((float)pCVar2->constant);
  extent_index = uVar7 + 3;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  *write_index = uVar7 + 4;
  return;
}

Assistant:

void ConstGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(1);
    uint16_t t4 = lhs->code(FACT_AFTER).asIndex();
    uint16_t t5 = lhs->code(FACT_BEFORE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t4, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, t5, t3, Opcodes::Sub, offset, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q0, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // q0:(bwd_opcode q1 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
}